

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lib.c
# Opt level: O0

size_t EVP_PKEY_get1_encoded_public_key(EVP_PKEY *pkey,uchar **ppub)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  EVP_PKEY *in_RSI;
  long in_RDI;
  size_t return_size;
  int rv;
  size_t *in_stack_00000098;
  size_t in_stack_000000a0;
  uchar *in_stack_000000a8;
  char *in_stack_000000b0;
  EVP_PKEY *in_stack_000000b8;
  void *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  size_t local_8;
  
  if ((in_RDI == 0) || (*(long *)(in_RDI + 0x60) == 0)) {
    iVar2 = evp_pkey_asn1_ctrl(in_RSI,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,
                               in_stack_ffffffffffffffd8);
    if (iVar2 < 1) {
      local_8 = 0;
    }
    else {
      local_8 = (size_t)iVar2;
    }
  }
  else {
    local_8 = 0xffffffffffffffff;
    EVP_PKEY_get_octet_string_param
              (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,
               in_stack_00000098);
    if (local_8 == 0xffffffffffffffff) {
      local_8 = 0;
    }
    else {
      pvVar3 = CRYPTO_malloc((int)local_8,"crypto/evp/p_lib.c",0x57a);
      *(void **)in_RSI = pvVar3;
      lVar1._0_4_ = in_RSI->type;
      lVar1._4_4_ = in_RSI->save_type;
      if (lVar1 == 0) {
        local_8 = 0;
      }
      else {
        iVar2 = EVP_PKEY_get_octet_string_param
                          (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,
                           in_stack_00000098);
        if (iVar2 == 0) {
          local_8 = 0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

size_t EVP_PKEY_get1_encoded_public_key(EVP_PKEY *pkey, unsigned char **ppub)
{
    int rv;

    if (pkey != NULL && evp_pkey_is_provided(pkey)) {
        size_t return_size = OSSL_PARAM_UNMODIFIED;

        /*
         * We know that this is going to fail, but it will give us a size
         * to allocate.
         */
        EVP_PKEY_get_octet_string_param(pkey,
                                        OSSL_PKEY_PARAM_ENCODED_PUBLIC_KEY,
                                        NULL, 0, &return_size);
        if (return_size == OSSL_PARAM_UNMODIFIED)
            return 0;

        *ppub = OPENSSL_malloc(return_size);
        if (*ppub == NULL)
            return 0;

        if (!EVP_PKEY_get_octet_string_param(pkey,
                                             OSSL_PKEY_PARAM_ENCODED_PUBLIC_KEY,
                                             *ppub, return_size, NULL))
            return 0;
        return return_size;
    }


    rv = evp_pkey_asn1_ctrl(pkey, ASN1_PKEY_CTRL_GET1_TLS_ENCPT, 0, ppub);
    if (rv <= 0)
        return 0;
    return rv;
}